

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall
cs_impl::any::holder<cs::type_t>::
holder<std::function<cs_impl::any()>const&,std::type_index_const&,std::shared_ptr<cs::name_space>&>
          (holder<cs::type_t> *this,function<cs_impl::any_()> *args,type_index *args_1,
          shared_ptr<cs::name_space> *args_2)

{
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> _Stack_68;
  type_id local_58;
  function<cs_impl::any_()> local_48;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_0023bd38;
  std::function<cs_impl::any_()>::function(&local_48,args);
  local_58.type_idx = (type_index)args_1->_M_target;
  local_58.type_hash = 0;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_68,&args_2->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>);
  cs::type_t::type_t(&this->mDat,&local_48,&local_58,(namespace_t *)&_Stack_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_68._M_refcount);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}